

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFormatParser.cpp
# Opt level: O2

int main(void)

{
  ulong uVar1;
  undefined8 uStack_40;
  allocator local_31;
  string local_30 [32];
  
  std::__cxx11::string::string(local_30,"CF64",&local_31);
  uVar1 = SoapySDR::formatToSize(local_30);
  std::__cxx11::string::~string(local_30);
  printf("%s -> %d bytes/element\t","CF64",uVar1 & 0xffffffff);
  if (uVar1 != 0x10) {
    uStack_40 = 0x10;
    goto LAB_001018bc;
  }
  puts("OK");
  std::__cxx11::string::string(local_30,"CF32",&local_31);
  uVar1 = SoapySDR::formatToSize(local_30);
  std::__cxx11::string::~string(local_30);
  printf("%s -> %d bytes/element\t","CF32",uVar1 & 0xffffffff);
  if (uVar1 == 8) {
    puts("OK");
    std::__cxx11::string::string(local_30,"CS32",&local_31);
    uVar1 = SoapySDR::formatToSize(local_30);
    std::__cxx11::string::~string(local_30);
    printf("%s -> %d bytes/element\t","CS32",uVar1 & 0xffffffff);
    if (uVar1 == 8) {
      puts("OK");
      std::__cxx11::string::string(local_30,"CU32",&local_31);
      uVar1 = SoapySDR::formatToSize(local_30);
      std::__cxx11::string::~string(local_30);
      printf("%s -> %d bytes/element\t","CU32",uVar1 & 0xffffffff);
      if (uVar1 == 8) {
        puts("OK");
        std::__cxx11::string::string(local_30,"CS16",&local_31);
        uVar1 = SoapySDR::formatToSize(local_30);
        std::__cxx11::string::~string(local_30);
        printf("%s -> %d bytes/element\t","CS16",uVar1 & 0xffffffff);
        if (uVar1 == 4) {
          puts("OK");
          std::__cxx11::string::string(local_30,"CU16",&local_31);
          uVar1 = SoapySDR::formatToSize(local_30);
          std::__cxx11::string::~string(local_30);
          printf("%s -> %d bytes/element\t","CU16",uVar1 & 0xffffffff);
          if (uVar1 == 4) {
            puts("OK");
            std::__cxx11::string::string(local_30,"CS12",&local_31);
            uVar1 = SoapySDR::formatToSize(local_30);
            std::__cxx11::string::~string(local_30);
            printf("%s -> %d bytes/element\t","CS12",uVar1 & 0xffffffff);
            if (uVar1 == 3) {
              puts("OK");
              std::__cxx11::string::string(local_30,"CU12",&local_31);
              uVar1 = SoapySDR::formatToSize(local_30);
              std::__cxx11::string::~string(local_30);
              printf("%s -> %d bytes/element\t","CU12",uVar1 & 0xffffffff);
              if (uVar1 == 3) {
                puts("OK");
                std::__cxx11::string::string(local_30,"CS8",&local_31);
                uVar1 = SoapySDR::formatToSize(local_30);
                std::__cxx11::string::~string(local_30);
                printf("%s -> %d bytes/element\t","CS8",uVar1 & 0xffffffff);
                if (uVar1 == 2) {
                  puts("OK");
                  std::__cxx11::string::string(local_30,"CU8",&local_31);
                  uVar1 = SoapySDR::formatToSize(local_30);
                  std::__cxx11::string::~string(local_30);
                  printf("%s -> %d bytes/element\t","CU8",uVar1 & 0xffffffff);
                  if (uVar1 == 2) {
                    puts("OK");
                    std::__cxx11::string::string(local_30,"CS4",&local_31);
                    uVar1 = SoapySDR::formatToSize(local_30);
                    std::__cxx11::string::~string(local_30);
                    printf("%s -> %d bytes/element\t","CS4",uVar1 & 0xffffffff);
                    if (uVar1 != 1) {
LAB_001018f2:
                      printf("FAIL: expected %d bytes!\n",1);
                      return 1;
                    }
                    puts("OK");
                    std::__cxx11::string::string(local_30,"CU4",&local_31);
                    uVar1 = SoapySDR::formatToSize(local_30);
                    std::__cxx11::string::~string(local_30);
                    printf("%s -> %d bytes/element\t","CU4",uVar1 & 0xffffffff);
                    if (uVar1 != 1) goto LAB_001018f2;
                    puts("OK");
                    std::__cxx11::string::string(local_30,"F64",&local_31);
                    uVar1 = SoapySDR::formatToSize(local_30);
                    std::__cxx11::string::~string(local_30);
                    printf("%s -> %d bytes/element\t","F64",uVar1 & 0xffffffff);
                    if (uVar1 != 8) goto LAB_001018b3;
                    puts("OK");
                    std::__cxx11::string::string(local_30,"F32",&local_31);
                    uVar1 = SoapySDR::formatToSize(local_30);
                    std::__cxx11::string::~string(local_30);
                    printf("%s -> %d bytes/element\t","F32",uVar1 & 0xffffffff);
                    if (uVar1 == 4) {
                      puts("OK");
                      std::__cxx11::string::string(local_30,"S32",&local_31);
                      uVar1 = SoapySDR::formatToSize(local_30);
                      std::__cxx11::string::~string(local_30);
                      printf("%s -> %d bytes/element\t","S32",uVar1 & 0xffffffff);
                      if (uVar1 == 4) {
                        puts("OK");
                        std::__cxx11::string::string(local_30,"U32",&local_31);
                        uVar1 = SoapySDR::formatToSize(local_30);
                        std::__cxx11::string::~string(local_30);
                        printf("%s -> %d bytes/element\t","U32",uVar1 & 0xffffffff);
                        if (uVar1 == 4) {
                          puts("OK");
                          std::__cxx11::string::string(local_30,"S16",&local_31);
                          uVar1 = SoapySDR::formatToSize(local_30);
                          std::__cxx11::string::~string(local_30);
                          printf("%s -> %d bytes/element\t","S16",uVar1 & 0xffffffff);
                          if (uVar1 == 2) {
                            puts("OK");
                            std::__cxx11::string::string(local_30,"U16",&local_31);
                            uVar1 = SoapySDR::formatToSize(local_30);
                            std::__cxx11::string::~string(local_30);
                            printf("%s -> %d bytes/element\t","U16",uVar1 & 0xffffffff);
                            if (uVar1 == 2) {
                              puts("OK");
                              std::__cxx11::string::string(local_30,"S8",&local_31);
                              uVar1 = SoapySDR::formatToSize(local_30);
                              std::__cxx11::string::~string(local_30);
                              printf("%s -> %d bytes/element\t","S8",uVar1 & 0xffffffff);
                              if (uVar1 == 1) {
                                puts("OK");
                                std::__cxx11::string::string(local_30,"U8",&local_31);
                                uVar1 = SoapySDR::formatToSize(local_30);
                                std::__cxx11::string::~string(local_30);
                                printf("%s -> %d bytes/element\t","U8",uVar1 & 0xffffffff);
                                if (uVar1 == 1) {
                                  puts("OK");
                                  puts("DONE!");
                                  return 0;
                                }
                              }
                              goto LAB_001018f2;
                            }
                          }
                          goto LAB_001018e7;
                        }
                      }
                    }
                    goto LAB_001018d1;
                  }
                }
LAB_001018e7:
                uStack_40 = 2;
                goto LAB_001018bc;
              }
            }
            uStack_40 = 3;
            goto LAB_001018bc;
          }
        }
LAB_001018d1:
        uStack_40 = 4;
        goto LAB_001018bc;
      }
    }
  }
LAB_001018b3:
  uStack_40 = 8;
LAB_001018bc:
  printf("FAIL: expected %d bytes!\n",uStack_40);
  return 1;
}

Assistant:

int main(void)
{
    #define formatCheck(formatStr, expectedSize) \
    { \
        size_t bytes = SoapySDR::formatToSize(formatStr); \
        printf("%s -> %d bytes/element\t", formatStr, int(bytes)); \
        if (bytes != expectedSize) \
        { \
            printf("FAIL: expected %d bytes!\n", int(expectedSize)); \
            return EXIT_FAILURE; \
        } \
        else printf("OK\n"); \
    }

    formatCheck(SOAPY_SDR_CF64, 16);
    formatCheck(SOAPY_SDR_CF32, 8);
    formatCheck(SOAPY_SDR_CS32, 8);
    formatCheck(SOAPY_SDR_CU32, 8);
    formatCheck(SOAPY_SDR_CS16, 4);
    formatCheck(SOAPY_SDR_CU16, 4);
    formatCheck(SOAPY_SDR_CS12, 3);
    formatCheck(SOAPY_SDR_CU12, 3);
    formatCheck(SOAPY_SDR_CS8, 2);
    formatCheck(SOAPY_SDR_CU8, 2);
    formatCheck(SOAPY_SDR_CS4, 1);
    formatCheck(SOAPY_SDR_CU4, 1);

    formatCheck(SOAPY_SDR_F64, 8);
    formatCheck(SOAPY_SDR_F32, 4);
    formatCheck(SOAPY_SDR_S32, 4);
    formatCheck(SOAPY_SDR_U32, 4);
    formatCheck(SOAPY_SDR_S16, 2);
    formatCheck(SOAPY_SDR_U16, 2);
    formatCheck(SOAPY_SDR_S8, 1);
    formatCheck(SOAPY_SDR_U8, 1);

    printf("DONE!\n");
    return EXIT_SUCCESS;
}